

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::TempDirDeleter::~TempDirDeleter(TempDirDeleter *this)

{
  ulong uVar1;
  TempDirDeleter *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    File::DeleteRecursively(&this->name_,(void *)0x0,(void *)0x0);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~TempDirDeleter() {
    if (!name_.empty()) {
      File::DeleteRecursively(name_, nullptr, nullptr);
    }
  }